

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O2

bool __thiscall spvtools::opt::Module::HasExplicitCapability(Module *this,uint32_t cap)

{
  Instruction *this_00;
  uint32_t uVar1;
  Instruction *pIVar2;
  Instruction *ci;
  
  this_00 = &(this->capabilities_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  pIVar2 = &(this->capabilities_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  do {
    this_00 = *(Instruction **)
               ((long)&this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction> + 8);
    if (this_00 == pIVar2) break;
    uVar1 = Instruction::GetSingleWordOperand(this_00,0);
  } while (uVar1 != cap);
  return this_00 != pIVar2;
}

Assistant:

bool Module::HasExplicitCapability(uint32_t cap) {
  for (auto& ci : capabilities_) {
    uint32_t tcap = ci.GetSingleWordOperand(0);
    if (tcap == cap) {
      return true;
    }
  }
  return false;
}